

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  RegularExpression *this_00;
  bool bVar1;
  iterator iVar2;
  char *pcVar3;
  string newline;
  string arg;
  
  this_00 = &this->IncludeRegexTransform;
  bVar1 = cmsys::RegularExpression::find(this_00,(line->_M_dataplus)._M_p);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&newline,this_00,3);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->TransformRules)._M_t,&newline);
    std::__cxx11::string::~string((string *)&newline);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header) {
      cmsys::RegularExpression::match_abi_cxx11_(&newline,this_00,1);
      cmsys::RegularExpression::match_abi_cxx11_(&arg,this_00,4);
      pcVar3 = *(char **)(iVar2._M_node + 2);
      do {
        if (*pcVar3 == '%') {
          std::__cxx11::string::append((string *)&newline);
        }
        else {
          if (*pcVar3 == '\0') {
            std::__cxx11::string::_M_assign((string *)line);
            std::__cxx11::string::~string((string *)&arg);
            std::__cxx11::string::~string((string *)&newline);
            return;
          }
          std::__cxx11::string::push_back((char)&newline);
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if(!this->IncludeRegexTransform.find(line.c_str()))
    {
    return;
    }
  TransformRulesType::const_iterator tri =
    this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if(tri == this->TransformRules.end())
    {
    return;
    }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for(const char* c = tri->second.c_str(); *c; ++c)
    {
    if(*c == '%')
      {
      newline += arg;
      }
    else
      {
      newline += *c;
      }
    }

  // Return the transformed line.
  line = newline;
}